

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

void Abc_NodePrintFactor(FILE *pFile,Abc_Obj_t *pNode,int fUseRealNames)

{
  char **pNamesIn;
  FILE *pFVar1;
  uint uVar2;
  Dec_Graph_t *pGraph;
  Vec_Ptr_t *vNames;
  char *pcVar3;
  size_t sStack_40;
  
  uVar2 = *(uint *)&pNode->field_0x14;
  if (0xfffffffd < (uVar2 & 0xf) - 5) {
    pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
    uVar2 = *(uint *)&pNode->field_0x14;
  }
  uVar2 = uVar2 & 0xf;
  if (uVar2 == 8) {
    pcVar3 = "Skipping the latch.\n";
    sStack_40 = 0x14;
  }
  else {
    if (uVar2 == 7) {
      pGraph = Dec_Factor((char *)(pNode->field_5).pData);
      pFVar1 = _stdout;
      if (fUseRealNames == 0) {
        pcVar3 = Abc_ObjName(pNode);
        Dec_GraphPrint(pFVar1,pGraph,(char **)0x0,pcVar3);
      }
      else {
        vNames = Abc_NodeGetFaninNames(pNode);
        pFVar1 = _stdout;
        pNamesIn = (char **)vNames->pArray;
        pcVar3 = Abc_ObjName(pNode);
        Dec_GraphPrint(pFVar1,pGraph,pNamesIn,pcVar3);
        Abc_NodeFreeNames(vNames);
      }
      free(pGraph->pNodes);
      free(pGraph);
      return;
    }
    if (uVar2 != 2) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPrint.c"
                    ,0x456,"void Abc_NodePrintFactor(FILE *, Abc_Obj_t *, int)");
    }
    pcVar3 = "Skipping the PI node.\n";
    sStack_40 = 0x16;
  }
  fwrite(pcVar3,sStack_40,1,(FILE *)pFile);
  return;
}

Assistant:

void Abc_NodePrintFactor( FILE * pFile, Abc_Obj_t * pNode, int fUseRealNames )
{
    Dec_Graph_t * pGraph;
    Vec_Ptr_t * vNamesIn;
    if ( Abc_ObjIsCo(pNode) )
        pNode = Abc_ObjFanin0(pNode);
    if ( Abc_ObjIsPi(pNode) )
    {
        fprintf( pFile, "Skipping the PI node.\n" );
        return;
    }
    if ( Abc_ObjIsLatch(pNode) )
    {
        fprintf( pFile, "Skipping the latch.\n" );
        return;
    }
    assert( Abc_ObjIsNode(pNode) );
    pGraph = Dec_Factor( (char *)pNode->pData );
    if ( fUseRealNames )
    {
        vNamesIn = Abc_NodeGetFaninNames(pNode);
        Dec_GraphPrint( stdout, pGraph, (char **)vNamesIn->pArray, Abc_ObjName(pNode) );
        Abc_NodeFreeNames( vNamesIn );
    }
    else
        Dec_GraphPrint( stdout, pGraph, (char **)NULL, Abc_ObjName(pNode) );
    Dec_GraphFree( pGraph );
}